

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O1

int arkPredict_CutoffOrder(ARKodeMem ark_mem,sunrealtype tau,N_Vector yguess)

{
  int iVar1;
  char *msgfmt;
  
  if (ark_mem == (ARKodeMem)0x0) {
    msgfmt = "ARKodeMem structure is NULL";
    ark_mem = (ARKodeMem)0x0;
    iVar1 = 0xb5c;
  }
  else {
    if (ark_mem->interp != (ARKInterp)0x0) {
      iVar1 = arkInterpEvaluate(ark_mem,ark_mem->interp,tau,0,(uint)(tau <= 0.5) * 4 + 1,yguess);
      return iVar1;
    }
    msgfmt = "ARKodeInterpMem structure is NULL";
    iVar1 = 0xb62;
  }
  arkProcessError(ark_mem,-0x15,iVar1,"arkPredict_CutoffOrder",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                  ,msgfmt);
  return -0x15;
}

Assistant:

int arkPredict_CutoffOrder(ARKodeMem ark_mem, sunrealtype tau, N_Vector yguess)
{
  int ord;
  sunrealtype tau_tol = HALF;

  /* verify that ark_mem and interpolation structure are provided */
  if (ark_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    "ARKodeMem structure is NULL");
    return (ARK_MEM_NULL);
  }
  if (ark_mem->interp == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    "ARKodeInterpMem structure is NULL");
    return (ARK_MEM_NULL);
  }

  /* set the polynomial order based on tau input */
  if (tau <= tau_tol) { ord = ARK_INTERP_MAX_DEGREE; }
  else { ord = 1; }

  /* call the interpolation module to do the work */
  return (arkInterpEvaluate(ark_mem, ark_mem->interp, tau, 0, ord, yguess));
}